

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

void __thiscall
Refal2::CInternalProgramBuilder::linkFunction
          (CInternalProgramBuilder *this,CPreparatoryFunction *function,
          TRuntimeModuleId runtimeModuleId)

{
  undefined8 this_00;
  bool bVar1;
  TPreparatoryFunctionType TVar2;
  element_type *this_01;
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  string *psVar3;
  COrdinaryFunction *this_03;
  TOperationAddress _firstOperation;
  undefined1 local_70 [24];
  CGlobalFunctionData *global;
  int globalIndex;
  undefined1 local_48 [24];
  CRuntimeFunctionPtr *runtimeFunction;
  CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCStack_28;
  int functionKey;
  CRuntimeFunctions *functions;
  CPreparatoryFunction *pCStack_18;
  TRuntimeModuleId runtimeModuleId_local;
  CPreparatoryFunction *function_local;
  CInternalProgramBuilder *this_local;
  
  functions._4_4_ = runtimeModuleId;
  pCStack_18 = function;
  function_local = (CPreparatoryFunction *)this;
  this_01 = std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->program);
  this_02 = &CProgram::Module(this_01,functions._4_4_)->Functions;
  pCStack_28 = this_02;
  psVar3 = CPreparatoryFunction::Name_abi_cxx11_(pCStack_18);
  runtimeFunction._4_4_ =
       CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::AddKey(this_02,psVar3);
  local_48._16_8_ =
       CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::GetData(pCStack_28,runtimeFunction._4_4_);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48._16_8_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!static_cast<bool>( runtimeFunction )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                  ,0x14d,
                  "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                 );
  }
  TVar2 = CPreparatoryFunction::GetType(pCStack_18);
  this_00 = local_48._16_8_;
  if (TVar2 == PFT_Empty) {
    std::__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->program);
    CProgram::EmptyFunction((CProgram *)local_48);
    std::shared_ptr<Refal2::CRuntimeFunction>::operator=
              ((shared_ptr<Refal2::CRuntimeFunction> *)local_48._16_8_,
               (shared_ptr<Refal2::CRuntimeFunction> *)local_48);
    std::shared_ptr<Refal2::CRuntimeFunction>::~shared_ptr
              ((shared_ptr<Refal2::CRuntimeFunction> *)local_48);
  }
  else if (TVar2 == PFT_External) {
    psVar3 = CPreparatoryFunction::ExternalName_abi_cxx11_(pCStack_18);
    global._0_4_ = CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::FindKey(&this->globals,psVar3);
    if ((int)global == -1) {
      __assert_fail("globalIndex != InvalidDictionaryIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                    ,0x15a,
                    "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                   );
    }
    local_70._16_8_ =
         CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::GetData(&this->globals,(int)global);
    CGlobalFunctionData::RuntimeFunction
              ((CGlobalFunctionData *)local_70,(CProgramPtr *)local_70._16_8_);
    std::shared_ptr<Refal2::CRuntimeFunction>::operator=
              ((shared_ptr<Refal2::CRuntimeFunction> *)local_48._16_8_,
               (shared_ptr<Refal2::CRuntimeFunction> *)local_70);
    std::shared_ptr<Refal2::CRuntimeFunction>::~shared_ptr
              ((shared_ptr<Refal2::CRuntimeFunction> *)local_70);
  }
  else {
    if (TVar2 != PFT_Compiled) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                    ,0x160,
                    "void Refal2::CInternalProgramBuilder::linkFunction(CPreparatoryFunction *, const TRuntimeModuleId)"
                   );
    }
    this_03 = (COrdinaryFunction *)operator_new(0x18);
    _firstOperation = CPreparatoryFunction::FirstOperation(pCStack_18);
    COrdinaryFunction::COrdinaryFunction(this_03,_firstOperation,functions._4_4_);
    std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
    reset<Refal2::COrdinaryFunction>
              ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,this_03
              );
  }
  return;
}

Assistant:

void CInternalProgramBuilder::linkFunction( CPreparatoryFunction* function,
	const TRuntimeModuleId runtimeModuleId )
{
	CRuntimeFunctions& functions = program->Module( runtimeModuleId ).Functions;
	const int functionKey = functions.AddKey( function->Name() );
	CRuntimeFunctionPtr& runtimeFunction = functions.GetData( functionKey );
	assert( !static_cast<bool>( runtimeFunction ) );

	switch( function->GetType() ) {
		case PFT_Empty:
			runtimeFunction = program->EmptyFunction();
			break;
		case PFT_Compiled:
			runtimeFunction.reset( new COrdinaryFunction(
				function->FirstOperation(), runtimeModuleId ) );
			break;
		case PFT_External:
		{
			const int globalIndex = globals.FindKey( function->ExternalName() );
			assert( globalIndex != InvalidDictionaryIndex );
			const CGlobalFunctionData& global = globals.GetData( globalIndex );
			runtimeFunction = global.RuntimeFunction( program );
			break;
		}
		default:
			assert( false );
			break;
	}
}